

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O2

basic_istream<char,_std::char_traits<char>_> *
trng::utility::operator>>
          (basic_istream<char,_std::char_traits<char>_> *in,ignore_spaces_cl *param_2)

{
  uint uVar1;
  
  while( true ) {
    if (*(int *)(in + *(long *)(*(long *)in + -0x18) + 0x20) != 0) {
      return in;
    }
    uVar1 = std::istream::peek();
    if (0x20 < uVar1) break;
    if ((0x100000600U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      return in;
    }
    std::istream::get();
  }
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, const ignore_spaces_cl &) {
        while (in.good()) {
          const auto c{in.peek()};
          if (c == traits_t::eof() or not(c == ' ' or c == '\t' or c == '\n'))
            break;
          in.get();
        }
        return in;
      }